

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

bool ot::commissioner::CaseInsensitiveEqual(string *aLhs,string *aRhs)

{
  __type _Var1;
  string sStack_58;
  string local_38;
  
  utils::ToLower(&sStack_58,aLhs);
  utils::ToLower(&local_38,aRhs);
  _Var1 = std::operator==(&sStack_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&sStack_58);
  return _Var1;
}

Assistant:

static inline bool CaseInsensitiveEqual(const std::string &aLhs, const std::string &aRhs)
{
    return ToLower(aLhs) == ToLower(aRhs);
}